

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void put_image_version(FILE *fp,uint8_t version)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint8_t header [8];
  undefined8 local_8;
  
  local_8._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
  local_8._0_5_ = CONCAT14(version,0x2174736c);
  sVar1 = 5;
  if (version < 3) {
    local_8 = (ulong)(uint5)local_8;
    sVar1 = 8;
  }
  sVar1 = fwrite(&local_8,sVar1,1,(FILE *)fp);
  if ((int)sVar1 == 1) {
    return;
  }
  error_impl("put_image_version",0x439,"put_image_version(): Unable to write version header data!",
             local_8);
  return;
}

Assistant:

void put_image_version(FILE *fp, uint8_t version)
{
    uint8_t header[IMAGE_HEADER_SIZE_OLD];
    size_t header_size = 0;
    int rc = 0;

    header[0] = (uint8_t)'l';
    header[1] = (uint8_t)'s';
    header[2] = (uint8_t)'t';
    header[3] = (uint8_t)'!';
    header[4] = version;

    if(version <= IMAGE_VERSION_2) {
        /* add the padding. */
        header[5] = (uint8_t)0;
        header[6] = (uint8_t)0;
        header[7] = (uint8_t)0;

        header_size = IMAGE_HEADER_SIZE_OLD;
    } else {
        header_size = IMAGE_HEADER_SIZE;
    }

    rc = (int)fwrite(&header, header_size, 1, fp);

    if(rc != 1) {
        error("put_image_version(): Unable to write version header data!");
    }
}